

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildRender32bppRectFromString
               (ImFontAtlas *atlas,int x,int y,int w,int h,char *in_str,char in_marker_char,
               uint in_marker_pixel_value)

{
  ulong uVar1;
  uint *puVar2;
  int off_x;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  
  if ((x < 0) || (atlas->TexWidth < w + x)) {
    __assert_fail("x >= 0 && x + w <= atlas->TexWidth",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                  ,0xa62,
                  "void ImFontAtlasBuildRender32bppRectFromString(ImFontAtlas *, int, int, int, int, const char *, char, unsigned int)"
                 );
  }
  if ((-1 < y) && (h + y <= atlas->TexHeight)) {
    puVar2 = atlas->TexPixelsRGBA32 + (ulong)(uint)x + (long)(atlas->TexWidth * y);
    iVar5 = 0;
    uVar1 = (ulong)(uint)w;
    if (w < 1) {
      uVar1 = 0;
    }
    if (h < 1) {
      h = iVar5;
    }
    for (; iVar5 != h; iVar5 = iVar5 + 1) {
      for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
        uVar4 = 0;
        if (in_str[uVar3] == in_marker_char) {
          uVar4 = in_marker_pixel_value;
        }
        puVar2[uVar3] = uVar4;
      }
      puVar2 = puVar2 + atlas->TexWidth;
      in_str = in_str + w;
    }
    return;
  }
  __assert_fail("y >= 0 && y + h <= atlas->TexHeight",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                ,0xa63,
                "void ImFontAtlasBuildRender32bppRectFromString(ImFontAtlas *, int, int, int, int, const char *, char, unsigned int)"
               );
}

Assistant:

void ImFontAtlasBuildRender32bppRectFromString(ImFontAtlas* atlas, int x, int y, int w, int h, const char* in_str, char in_marker_char, unsigned int in_marker_pixel_value)
{
    IM_ASSERT(x >= 0 && x + w <= atlas->TexWidth);
    IM_ASSERT(y >= 0 && y + h <= atlas->TexHeight);
    unsigned int* out_pixel = atlas->TexPixelsRGBA32 + x + (y * atlas->TexWidth);
    for (int off_y = 0; off_y < h; off_y++, out_pixel += atlas->TexWidth, in_str += w)
        for (int off_x = 0; off_x < w; off_x++)
            out_pixel[off_x] = (in_str[off_x] == in_marker_char) ? in_marker_pixel_value : IM_COL32_BLACK_TRANS;
}